

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value::set_allocated_blobfilevalue
          (Value *this,Value_BlobFileValue *blobfilevalue)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Value_BlobFileValue *blobfilevalue_local;
  Value *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (blobfilevalue != (Value_BlobFileValue *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::Value_BlobFileValue>::GetOwningArena
                   (blobfilevalue);
    message_arena = (Arena *)blobfilevalue;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::Value_BlobFileValue>
                              (message_arena_00,blobfilevalue,submessage_arena_00);
    }
    set_has_blobfilevalue(this);
    (this->value_).immediatevalue_ = (Value_ImmediateValue *)message_arena;
  }
  return;
}

Assistant:

void Value::set_allocated_blobfilevalue(::CoreML::Specification::MILSpec::Value_BlobFileValue* blobfilevalue) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (blobfilevalue) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::Value_BlobFileValue>::GetOwningArena(blobfilevalue);
    if (message_arena != submessage_arena) {
      blobfilevalue = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, blobfilevalue, submessage_arena);
    }
    set_has_blobfilevalue();
    value_.blobfilevalue_ = blobfilevalue;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.Value.blobFileValue)
}